

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

void __thiscall
duckdb::StandardColumnWriter<unsigned_char,_int,_duckdb::ParquetCastOperator>::
WriteVectorInternal<false>
          (StandardColumnWriter<unsigned_char,_int,_duckdb::ParquetCastOperator> *this,
          WriteStream *temp_writer,ColumnWriterStatistics *stats,ColumnWriterPageState *page_state_p
          ,Vector *input_column,idx_t chunk_start,idx_t chunk_end)

{
  Vector VVar1;
  Vector *col;
  uint uVar2;
  idx_t i;
  Allocator *pAVar3;
  long lVar4;
  idx_t iVar5;
  primitive_dictionary_entry_t *ppVar6;
  InternalException *this_00;
  ValidityMask *mask;
  NumericStatisticsState<unsigned_char,_int,_duckdb::BaseParquetOperator> *numeric_stats;
  WriteStream *ser;
  idx_t r;
  idx_t iVar7;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  StandardColumnWriter<unsigned_char,_int,_duckdb::ParquetCastOperator> *local_40;
  DlbaEncoder *local_38;
  
  ser = (WriteStream *)chunk_start;
  local_40 = this;
  FlatVector::VerifyFlatVector(input_column);
  if (9 < *(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
switchD_0026371d_caseD_1:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Unknown encoding","");
    duckdb::InternalException::InternalException(this_00,(string *)local_60);
    __cxa_throw(this_00,&InternalException::typeinfo,std::runtime_error::~runtime_error);
  }
  col = *(Vector **)(input_column + 0x20);
  mask = (ValidityMask *)(input_column + 0x28);
  switch(*(uint *)&page_state_p[1]._vptr_ColumnWriterPageState) {
  case 0:
    if (*(long *)mask == 0) {
      TemplatedWritePlain<unsigned_char,int,duckdb::ParquetCastOperator,true>
                (col,stats,chunk_start,chunk_end,(ValidityMask *)temp_writer,ser);
      return;
    }
    TemplatedWritePlain<unsigned_char,int,duckdb::ParquetCastOperator,false>
              (col,stats,chunk_start,chunk_end,mask,temp_writer);
    return;
  default:
    goto switchD_0026371d_caseD_1;
  case 5:
    if ((chunk_start < chunk_end) &&
       (*(char *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) == '\0')) {
      iVar7 = chunk_start;
      do {
        iVar5 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar5 = iVar7, (*(ulong *)(*(long *)mask + (iVar7 >> 6) * 8) >> (iVar7 & 0x3f) & 1) != 0
           )) {
          VVar1 = col[iVar5];
          if ((int)(uint)(byte)VVar1 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(uint *)&stats[1]._vptr_ColumnWriterStatistics = (uint)(byte)VVar1;
          }
          uVar2 = (uint)(byte)VVar1;
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < (int)uVar2) {
            *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = uVar2;
          }
          local_60[0] = (undefined1 *)(ulong)uVar2;
          DbpEncoder::BeginWriteInternal
                    ((DbpEncoder *)(page_state_p + 2),temp_writer,(int64_t *)local_60);
          *(undefined1 *)((long)&page_state_p[1]._vptr_ColumnWriterPageState + 4) = 1;
          chunk_start = iVar5 + 1;
          goto LAB_00263a99;
        }
        iVar7 = iVar7 + 1;
      } while (chunk_end != iVar7);
    }
    else {
LAB_00263a99:
      if (chunk_start < chunk_end) {
        do {
          if ((*(long *)mask == 0) ||
             ((*(ulong *)(*(long *)mask + (chunk_start >> 6) * 8) >> (chunk_start & 0x3f) & 1) != 0)
             ) {
            VVar1 = col[chunk_start];
            if ((int)(uint)(byte)VVar1 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
              *(uint *)&stats[1]._vptr_ColumnWriterStatistics = (uint)(byte)VVar1;
            }
            uVar2 = (uint)(byte)VVar1;
            if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < (int)uVar2) {
              *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = uVar2;
            }
            local_60[0] = (undefined1 *)(ulong)uVar2;
            DbpEncoder::WriteValueInternal
                      ((DbpEncoder *)(page_state_p + 2),temp_writer,(int64_t *)local_60);
          }
          chunk_start = chunk_start + 1;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 6:
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x908]._vptr_ColumnWriterPageState == '\0')) {
      iVar7 = chunk_start;
      do {
        iVar5 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar5 = iVar7, (*(ulong *)(*(long *)mask + (iVar7 >> 6) * 8) >> (iVar7 & 0x3f) & 1) != 0
           )) {
          VVar1 = col[iVar5];
          local_60[0] = (undefined1 *)CONCAT44(local_60[0]._4_4_,(uint)(byte)VVar1);
          uVar2 = (uint)(byte)VVar1;
          if ((int)uVar2 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(uint *)&stats[1]._vptr_ColumnWriterStatistics = uVar2;
          }
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < (int)uVar2) {
            *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = (uint)(byte)VVar1;
          }
          local_38 = (DlbaEncoder *)(page_state_p + 0x909);
          pAVar3 = (Allocator *)
                   duckdb::BufferAllocator::Get
                             (((local_40->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                              context);
          DlbaEncoder::BeginWrite<int>(local_38,pAVar3,temp_writer,(int *)local_60);
          *(undefined1 *)&page_state_p[0x908]._vptr_ColumnWriterPageState = 1;
          chunk_start = iVar5 + 1;
          goto LAB_00263963;
        }
        iVar7 = iVar7 + 1;
      } while (chunk_end != iVar7);
    }
    else {
LAB_00263963:
      if (chunk_start < chunk_end) {
        do {
          if ((*(long *)mask == 0) ||
             ((*(ulong *)(*(long *)mask + (chunk_start >> 6) * 8) >> (chunk_start & 0x3f) & 1) != 0)
             ) {
            VVar1 = col[chunk_start];
            local_60[0] = (undefined1 *)CONCAT44(local_60[0]._4_4_,(uint)(byte)VVar1);
            uVar2 = (uint)(byte)VVar1;
            if ((int)uVar2 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
              *(uint *)&stats[1]._vptr_ColumnWriterStatistics = uVar2;
            }
            if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < (int)uVar2) {
              *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = (uint)(byte)VVar1;
            }
            DlbaEncoder::WriteValue<int>
                      ((DlbaEncoder *)(page_state_p + 0x909),temp_writer,(int *)local_60);
          }
          chunk_start = chunk_start + 1;
        } while (chunk_end != chunk_start);
      }
    }
    break;
  case 8:
    iVar7 = chunk_start;
    if ((chunk_start < chunk_end) &&
       (*(char *)&page_state_p[0x121c]._vptr_ColumnWriterPageState == '\0')) {
      iVar5 = chunk_start;
      do {
        iVar7 = chunk_start;
        if ((*(long *)mask == 0) ||
           (iVar7 = iVar5, (*(ulong *)(*(long *)mask + (iVar5 >> 6) * 8) >> (iVar5 & 0x3f) & 1) != 0
           )) {
          local_60[0] = (undefined1 *)
                        CONCAT71(local_60[0]._1_7_,
                                 *(undefined1 *)
                                  ((long)&page_state_p[0x121c]._vptr_ColumnWriterPageState + 4));
          (*(code *)**(undefined8 **)temp_writer)(temp_writer,local_60,1);
          page_state_p[0x121f]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          page_state_p[0x1320]._vptr_ColumnWriterPageState = (_func_int **)0x0;
          *(undefined1 *)&page_state_p[0x121c]._vptr_ColumnWriterPageState = 1;
          goto LAB_002639ff;
        }
        iVar5 = iVar5 + 1;
      } while (chunk_end != iVar5);
    }
    else {
LAB_002639ff:
      if (iVar7 < chunk_end) {
        do {
          if ((*(long *)mask == 0) ||
             ((*(ulong *)(*(long *)mask + (iVar7 >> 6) * 8) >> (iVar7 & 0x3f) & 1) != 0)) {
            ppVar6 = PrimitiveDictionary<unsigned_char,_int,_duckdb::ParquetCastOperator>::Lookup
                               ((PrimitiveDictionary<unsigned_char,_int,_duckdb::ParquetCastOperator>
                                 *)page_state_p[0x121b]._vptr_ColumnWriterPageState,
                                (uchar *)(col + iVar7));
            local_60[0] = (undefined1 *)CONCAT44(local_60[0]._4_4_,ppVar6->index);
            RleBpEncoder::WriteValue
                      ((RleBpEncoder *)(page_state_p + 0x121d),temp_writer,(uint32_t *)local_60);
          }
          iVar7 = iVar7 + 1;
        } while (chunk_end != iVar7);
      }
    }
    break;
  case 9:
    if (*(char *)&page_state_p[0x1214]._vptr_ColumnWriterPageState == '\x01') {
      pAVar3 = (Allocator *)
               duckdb::BufferAllocator::Get
                         (((local_40->super_PrimitiveColumnWriter).super_ColumnWriter.writer)->
                          context);
      BssEncoder::BeginWrite((BssEncoder *)(page_state_p + 0x1215),pAVar3);
      *(undefined1 *)&page_state_p[0x1214]._vptr_ColumnWriterPageState = 1;
    }
    if (chunk_start < chunk_end) {
      do {
        if ((*(long *)mask == 0) ||
           ((*(ulong *)(*(long *)mask + (chunk_start >> 6) * 8) >> (chunk_start & 0x3f) & 1) != 0))
        {
          VVar1 = col[chunk_start];
          local_60[0] = (undefined1 *)CONCAT44(local_60[0]._4_4_,(uint)(byte)VVar1);
          uVar2 = (uint)(byte)VVar1;
          if ((int)uVar2 < *(int *)&stats[1]._vptr_ColumnWriterStatistics) {
            *(uint *)&stats[1]._vptr_ColumnWriterStatistics = uVar2;
          }
          if (*(int *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) < (int)uVar2) {
            *(uint *)((long)&stats[1]._vptr_ColumnWriterStatistics + 4) = (uint)(byte)VVar1;
          }
          lVar4 = 0;
          do {
            *(undefined1 *)
             ((long)page_state_p[0x1217]._vptr_ColumnWriterPageState +
             (long)((long)page_state_p[0x1215]._vptr_ColumnWriterPageState * lVar4 +
                   (long)page_state_p[0x1219]._vptr_ColumnWriterPageState)) =
                 *(undefined1 *)((long)local_60 + lVar4);
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          page_state_p[0x1217]._vptr_ColumnWriterPageState =
               (_func_int **)((long)page_state_p[0x1217]._vptr_ColumnWriterPageState + 1);
        }
        chunk_start = chunk_start + 1;
      } while (chunk_start != chunk_end);
    }
  }
  return;
}

Assistant:

void WriteVectorInternal(WriteStream &temp_writer, ColumnWriterStatistics *stats,
	                         ColumnWriterPageState *page_state_p, Vector &input_column, idx_t chunk_start,
	                         idx_t chunk_end) {
		auto &page_state = page_state_p->Cast<StandardWriterPageState<SRC, TGT, OP>>();

		const auto &mask = FlatVector::Validity(input_column);
		const auto *data_ptr = FlatVector::GetData<SRC>(input_column);

		switch (page_state.encoding) {
		case duckdb_parquet::Encoding::RLE_DICTIONARY: {
			idx_t r = chunk_start;
			if (!page_state.dict_written_value) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					// write the bit-width as a one-byte entry and initialize writer
					temp_writer.Write<uint8_t>(page_state.dict_bit_width);
					page_state.dict_encoder.BeginWrite();
					page_state.dict_written_value = true;
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const auto &src_value = data_ptr[r];
				const auto value_index = page_state.dictionary.GetIndex(src_value);
				page_state.dict_encoder.WriteValue(temp_writer, value_index);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_BINARY_PACKED: {
			idx_t r = chunk_start;
			if (!page_state.dbp_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dbp_encoder.BeginWrite(temp_writer, target_value);
					page_state.dbp_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dbp_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::DELTA_LENGTH_BYTE_ARRAY: {
			idx_t r = chunk_start;
			if (!page_state.dlba_initialized) {
				// find first non-null value
				for (; r < chunk_end; r++) {
					if (!mask.RowIsValid(r)) {
						continue;
					}
					const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
					OP::template HandleStats<SRC, TGT>(stats, target_value);
					page_state.dlba_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()), temp_writer,
					                                   target_value);
					page_state.dlba_initialized = true;
					r++; // skip over
					break;
				}
			}

			for (; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.dlba_encoder.WriteValue(temp_writer, target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::BYTE_STREAM_SPLIT: {
			if (page_state.bss_initialized) {
				page_state.bss_encoder.BeginWrite(BufferAllocator::Get(writer.GetContext()));
				page_state.bss_initialized = true;
			}
			for (idx_t r = chunk_start; r < chunk_end; r++) {
				if (!ALL_VALID && !mask.RowIsValid(r)) {
					continue;
				}
				const TGT target_value = OP::template Operation<SRC, TGT>(data_ptr[r]);
				OP::template HandleStats<SRC, TGT>(stats, target_value);
				page_state.bss_encoder.WriteValue(target_value);
			}
			break;
		}
		case duckdb_parquet::Encoding::PLAIN: {
			D_ASSERT(page_state.encoding == duckdb_parquet::Encoding::PLAIN);
			if (mask.AllValid()) {
				TemplatedWritePlain<SRC, TGT, OP, true>(input_column, stats, chunk_start, chunk_end, mask, temp_writer);
			} else {
				TemplatedWritePlain<SRC, TGT, OP, false>(input_column, stats, chunk_start, chunk_end, mask,
				                                         temp_writer);
			}
			break;
		}
		default:
			throw InternalException("Unknown encoding");
		}
	}